

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O3

bool __thiscall wallet::SQLiteBatch::ReadKey(SQLiteBatch *this,DataStream *key,DataStream *value)

{
  wallet *this_00;
  pointer pbVar1;
  sqlite3_stmt *psVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  string *in_R9;
  pointer pbVar6;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  Span<const_std::byte> blob;
  long *local_58 [2];
  long local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_database->m_db != (sqlite3 *)0x0) {
    this_00 = (wallet *)this->m_read_stmt;
    if (this_00 == (wallet *)0x0) {
      __assert_fail("m_read_stmt",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/sqlite.cpp"
                    ,0x1cc,"virtual bool wallet::SQLiteBatch::ReadKey(DataStream &&, DataStream &)")
      ;
    }
    pbVar6 = (key->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
             .super__Vector_impl_data._M_start + key->m_read_pos;
    pbVar1 = (key->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
             .super__Vector_impl_data._M_finish;
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"key","");
    blob.m_size = (size_t)local_58;
    blob.m_data = pbVar1 + -(long)pbVar6;
    bVar3 = BindBlobToStatement(this_00,(sqlite3_stmt *)0x1,(int)pbVar6,blob,in_R9);
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    if (bVar3) {
      iVar4 = sqlite3_step(this->m_read_stmt);
      if (iVar4 == 100) {
        pbVar1 = (value->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((value->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
            _M_impl.super__Vector_impl_data._M_finish != pbVar1) {
          (value->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_finish = pbVar1;
        }
        value->m_read_pos = 0;
        psVar2 = this->m_read_stmt;
        lVar5 = sqlite3_column_blob(psVar2,0);
        iVar4 = sqlite3_column_bytes(psVar2,0);
        std::vector<std::byte,zero_after_free_allocator<std::byte>>::
        _M_range_insert<std::byte_const*>
                  ((vector<std::byte,zero_after_free_allocator<std::byte>> *)value,
                   (value->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                   ._M_impl.super__Vector_impl_data._M_finish,lVar5,iVar4 + lVar5);
        bVar3 = true;
      }
      else {
        if (iVar4 != 0x65) {
          local_58[0] = (long *)sqlite3_errstr(iVar4);
          source_file._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/sqlite.cpp"
          ;
          source_file._M_len = 0x61;
          logging_function._M_str = "ReadKey";
          logging_function._M_len = 7;
          LogPrintFormatInternal<char[8],char_const*>
                    (logging_function,source_file,0x1d4,ALL,Info,
                     (ConstevalFormatString<2U>)0x10ec613,(char (*) [8])"ReadKey",(char **)local_58)
          ;
        }
        bVar3 = false;
      }
      sqlite3_clear_bindings(this->m_read_stmt);
      sqlite3_reset(this->m_read_stmt);
      goto LAB_00c4cfc4;
    }
  }
  bVar3 = false;
LAB_00c4cfc4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool SQLiteBatch::ReadKey(DataStream&& key, DataStream& value)
{
    if (!m_database.m_db) return false;
    assert(m_read_stmt);

    // Bind: leftmost parameter in statement is index 1
    if (!BindBlobToStatement(m_read_stmt, 1, key, "key")) return false;
    int res = sqlite3_step(m_read_stmt);
    if (res != SQLITE_ROW) {
        if (res != SQLITE_DONE) {
            // SQLITE_DONE means "not found", don't log an error in that case.
            LogPrintf("%s: Unable to execute statement: %s\n", __func__, sqlite3_errstr(res));
        }
        sqlite3_clear_bindings(m_read_stmt);
        sqlite3_reset(m_read_stmt);
        return false;
    }
    // Leftmost column in result is index 0
    value.clear();
    value.write(SpanFromBlob(m_read_stmt, 0));

    sqlite3_clear_bindings(m_read_stmt);
    sqlite3_reset(m_read_stmt);
    return true;
}